

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O0

void handlebars::
     dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
     ::push_event<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *signal,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  event_type local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *signal_local;
  
  local_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)signal;
  std::__cxx11::string::string((string *)&local_50,(string *)signal);
  std::
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::
  tuple<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_true,_true>
            (&local_50.args,local_18);
  std::
  deque<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type,std::allocator<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type>>
  ::
  emplace_back<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type>
            ((deque<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type,std::allocator<handlebars::dispatcher<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::event_type>>
              *)&dispatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::m_event_queue,&local_50);
  dispatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::event_type::~event_type(&local_50);
  return;
}

Assistant:

void
				dispatcher<SignalT, HandlerArgTs...>::push_event(const SignalT& signal, FwdHandlerArgTs&&... args)
		{
				m_event_queue.emplace_back(event_type{
						signal, args_storage_type{ std::forward<FwdHandlerArgTs>(args)... } });
		}